

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata_impl.h
# Opt level: O0

QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QSpanCollection::Span_*,_std::less<int>,_std::allocator<std::pair<const_int,_QSpanCollection::Span_*>_>_>_>_>
* __thiscall
QtPrivate::
QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QSpanCollection::Span_*,_std::less<int>,_std::allocator<std::pair<const_int,_QSpanCollection::Span_*>_>_>_>_>
::operator=(QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QSpanCollection::Span_*,_std::less<int>,_std::allocator<std::pair<const_int,_QSpanCollection::Span_*>_>_>_>_>
            *this,QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QSpanCollection::Span_*,_std::less<int>,_std::allocator<std::pair<const_int,_QSpanCollection::Span_*>_>_>_>_>
                  *other)

{
  long lVar1;
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QSpanCollection::Span_*,_std::less<int>,_std::allocator<std::pair<const_int,_QSpanCollection::Span_*>_>_>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QSpanCollection::Span_*,_std::less<int>,_std::allocator<std::pair<const_int,_QSpanCollection::Span_*>_>_>_>_>
  copy;
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QSpanCollection::Span_*,_std::less<int>,_std::allocator<std::pair<const_int,_QSpanCollection::Span_*>_>_>_>_>
  *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QExplicitlySharedDataPointerV2(in_RDI,in_stack_ffffffffffffffc8);
  swap(in_RDI,in_stack_ffffffffffffffc8);
  ~QExplicitlySharedDataPointerV2(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QExplicitlySharedDataPointerV2 &operator=(const QExplicitlySharedDataPointerV2 &other) noexcept
    {
        QExplicitlySharedDataPointerV2 copy(other);
        swap(copy);
        return *this;
    }